

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

bool FIX::Session::sendToTarget(Message *message,string *qualifier)

{
  bool bVar1;
  SessionID sessionID;
  
  Message::getSessionID(&sessionID,message,qualifier);
  bVar1 = sendToTarget(message,&sessionID);
  SessionID::~SessionID(&sessionID);
  return bVar1;
}

Assistant:

EXCEPT(SessionNotFound) {
  try {
    SessionID sessionID = message.getSessionID(qualifier);
    return sendToTarget(message, sessionID);
  } catch (FieldNotFound &) {
    throw SessionNotFound();
  }
}